

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmenu.cpp
# Opt level: O0

void __thiscall
QMenuPrivate::setCurrentAction
          (QMenuPrivate *this,QAction *action,int popup,SelectionReason reason,bool activateFirst)

{
  long lVar1;
  bool bVar2;
  FocusPolicy FVar3;
  QMenuPrivate *pQVar4;
  QMenu *pQVar5;
  ulong uVar6;
  QWidget *this_00;
  int in_ECX;
  int in_EDX;
  QAction *in_RSI;
  QMenuPrivate *in_RDI;
  undefined1 in_R8B;
  long in_FS_OFFSET;
  QRect QVar7;
  QWidget *widget;
  QAction *previousAction;
  QMenu *hideActiveMenu;
  QMenu *menu;
  QMenu *q;
  QActionPrivate *in_stack_ffffffffffffff48;
  QMenuPrivate *in_stack_ffffffffffffff50;
  QMenuPrivate *in_stack_ffffffffffffff58;
  QMenuPrivate *this_01;
  QMenuPrivate *in_stack_ffffffffffffff60;
  QMenuPrivate *in_stack_ffffffffffffff68;
  QWidget *in_stack_ffffffffffffff90;
  SelectionReason in_stack_ffffffffffffff98;
  undefined3 in_stack_ffffffffffffff9c;
  uint popup_00;
  QMenu *in_stack_ffffffffffffffc8;
  QAction *local_10;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  popup_00 = CONCAT13(in_R8B,in_stack_ffffffffffffff9c) & 0x1ffffff;
  pQVar4 = (QMenuPrivate *)q_func(in_RDI);
  *(ushort *)&in_RDI->field_0x420 = *(ushort *)&in_RDI->field_0x420 & 0xf7ff;
  bVar2 = considerAction(in_stack_ffffffffffffff58,(QAction *)in_stack_ffffffffffffff50);
  local_10 = in_RSI;
  if (!bVar2) {
    local_10 = (QAction *)0x0;
  }
  if (in_ECX != 0) {
    ::QPointer::operator_cast_to_QWidget_((QPointer<QWidget> *)0x641215);
    in_stack_ffffffffffffff90 = &qobject_cast<QMenu*>((QObject *)0x64121d)->super_QWidget;
    if ((in_stack_ffffffffffffff90 != (QWidget *)0x0) &&
       (bVar2 = ::QPointer::operator_cast_to_bool((QPointer<QAction> *)0x641243), bVar2)) {
      QMenu::d_func((QMenu *)0x641256);
      bVar2 = ::operator==((QPointer<QMenu> *)in_stack_ffffffffffffff50,
                           (QMenu **)in_stack_ffffffffffffff48);
      if ((bVar2) && ((*(ushort *)&in_RDI->field_0x420 >> 6 & 1) != 0)) {
        QMenu::d_func((QMenu *)0x64129a);
        bVar2 = ::operator!=((QAction **)in_stack_ffffffffffffff50,
                             (QPointer<QAction> *)in_stack_ffffffffffffff48);
        if (bVar2) {
          in_stack_ffffffffffffff68 = QMenu::d_func((QMenu *)0x6412c9);
          ::QPointer::operator_cast_to_QAction_((QPointer<QAction> *)0x6412e3);
          setCurrentAction((QMenuPrivate *)CONCAT44(in_EDX,in_ECX),(QAction *)pQVar4,popup_00,
                           in_stack_ffffffffffffff98,
                           SUB81((ulong)in_stack_ffffffffffffff90 >> 0x38,0));
        }
      }
    }
  }
  this_01 = pQVar4;
  if (in_RDI->currentAction != (QAction *)0x0) {
    actionRect(pQVar4,(QAction *)in_stack_ffffffffffffff68);
    QWidget::update((QWidget *)in_stack_ffffffffffffff58,(QRect *)in_stack_ffffffffffffff50);
    in_stack_ffffffffffffff60 = pQVar4;
  }
  pQVar5 = ::QPointer::operator_cast_to_QMenu_((QPointer<QMenu> *)0x641360);
  pQVar4 = (QMenuPrivate *)in_RDI->currentAction;
  in_RDI->currentAction = local_10;
  if (local_10 == (QAction *)0x0) {
    if (pQVar4 != (QMenuPrivate *)0x0) {
      in_stack_ffffffffffffff48 = QAction::d_func((QAction *)0x6414ca);
      in_stack_ffffffffffffff50 = (QMenuPrivate *)topCausedWidget(in_stack_ffffffffffffff50);
      QString::QString((QString *)0x6414e7);
      QActionPrivate::showStatusText
                ((QObject *)in_stack_ffffffffffffff48,(QString *)in_stack_ffffffffffffff50);
      QString::~QString((QString *)0x641504);
    }
  }
  else {
    uVar6 = QAction::isSeparator();
    if ((uVar6 & 1) == 0) {
      activateAction((QMenuPrivate *)CONCAT44(popup_00,in_stack_ffffffffffffff98),
                     (QAction *)in_stack_ffffffffffffff90,(ActionEvent)((ulong)pQVar5 >> 0x20),
                     SUB81((ulong)pQVar5 >> 0x18,0));
      if ((in_EDX != -1) && (bVar2 = QWidget::isVisible((QWidget *)0x6413d9), bVar2)) {
        popupAction(in_RDI,(QAction *)in_stack_ffffffffffffff68,
                    (int)((ulong)in_stack_ffffffffffffff60 >> 0x20),
                    SUB81((ulong)in_stack_ffffffffffffff60 >> 0x18,0));
      }
      QVar7 = actionRect(in_stack_ffffffffffffff60,(QAction *)in_stack_ffffffffffffff68);
      in_stack_ffffffffffffffc8 = QVar7._0_8_;
      QWidget::update((QWidget *)this_01,(QRect *)in_stack_ffffffffffffff50);
      if (in_ECX == 0) {
        this_00 = QHash<QAction_*,_QWidget_*>::value
                            ((QHash<QAction_*,_QWidget_*> *)this_01,
                             (QAction **)in_stack_ffffffffffffff50);
        if (this_00 == (QWidget *)0x0) {
          bVar2 = QWidget::hasFocus((QWidget *)in_stack_ffffffffffffff68);
          if (!bVar2) {
            QWidget::setFocus(in_stack_ffffffffffffff90,(FocusReason)((ulong)pQVar5 >> 0x20));
          }
        }
        else {
          FVar3 = QWidget::focusPolicy(this_00);
          if (FVar3 != NoFocus) {
            QWidget::setFocus(in_stack_ffffffffffffff90,(FocusReason)((ulong)pQVar5 >> 0x20));
          }
        }
      }
    }
  }
  if ((pQVar5 != (QMenu *)0x0) && (pQVar4 != (QMenuPrivate *)in_RDI->currentAction)) {
    if (in_EDX == -1) {
      qFadeEffect((QWidget *)in_stack_ffffffffffffff50,
                  (int)((ulong)in_stack_ffffffffffffff48 >> 0x20));
      qScrollEffect((QWidget *)in_stack_ffffffffffffff50,
                    (DirFlags)((ulong)in_stack_ffffffffffffff48 >> 0x20),
                    (int)in_stack_ffffffffffffff48);
      hideMenu(pQVar4,in_stack_ffffffffffffffc8);
    }
    else if ((in_RDI->currentAction == (QAction *)0x0) ||
            (pQVar5 = QAction::menu<QMenu*>((QAction *)0x64157e), pQVar5 == (QMenu *)0x0)) {
      QMenuSloppyState::startTimerIfNotRunning((QMenuSloppyState *)in_stack_ffffffffffffff50);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QMenuPrivate::setCurrentAction(QAction *action, int popup, SelectionReason reason, bool activateFirst)
{
    Q_Q(QMenu);
    tearoffHighlighted = 0;

    if (!considerAction(action))
        action = nullptr;

    // Reselect the currently active action in case mouse moved over other menu items when
    // moving from sub menu action to sub menu (QTBUG-20094).
    if (reason != SelectedFromKeyboard) {
        if (QMenu *menu = qobject_cast<QMenu*>(causedPopup.widget)) {
            if (causedPopup.action && menu->d_func()->activeMenu == q)
                // Reselect parent menu action only if mouse is over a menu and parent menu action is not already selected (QTBUG-47987)
                if (hasReceievedEnter && menu->d_func()->currentAction != causedPopup.action)
                    menu->d_func()->setCurrentAction(causedPopup.action, 0, reason, false);
        }
    }

    if (currentAction)
        q->update(actionRect(currentAction));

    QMenu *hideActiveMenu = activeMenu;
    QAction *previousAction = currentAction;

    currentAction = action;
    if (action) {
        if (!action->isSeparator()) {
            activateAction(action, QAction::Hover);
            if (popup != -1) {
                // if the menu is visible then activate the required action,
                // otherwise we just mark the action as currentAction
                // and activate it when the menu will be popuped.
                if (q->isVisible())
                    popupAction(currentAction, popup, activateFirst);
            }
            q->update(actionRect(action));

            if (reason == SelectedFromKeyboard) {
                QWidget *widget = widgetItems.value(action);
                if (widget) {
                    if (widget->focusPolicy() != Qt::NoFocus)
                        widget->setFocus(Qt::TabFocusReason);
                } else {
                    //when the action has no QWidget, the QMenu itself should
                    // get the focus
                    // Since the menu is a pop-up, it uses the popup reason.
                    if (!q->hasFocus()) {
                        q->setFocus(Qt::PopupFocusReason);
                    }
                }
            }
        }
#if QT_CONFIG(statustip)
    }  else if (previousAction) {
        previousAction->d_func()->showStatusText(topCausedWidget(), QString());
#endif
    }
    if (hideActiveMenu && previousAction != currentAction) {
        if (popup == -1) {
#if QT_CONFIG(effects)
            // kill any running effect
            qFadeEffect(nullptr);
            qScrollEffect(nullptr);
#endif
            hideMenu(hideActiveMenu);
        } else if (!currentAction || !currentAction->menu()) {
            sloppyState.startTimerIfNotRunning();
        }
    }
}